

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcolumn_bmod.c
# Opt level: O3

int zcolumn_bmod(int jcol,int nseg,doublecomplex *dense,doublecomplex *tempv,int *segrep,int *repfnz
                ,int fpanelc,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int_t *piVar11;
  undefined1 auVar12 [16];
  doublecomplex dVar13;
  doublecomplex dVar14;
  doublecomplex dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  int_t *piVar20;
  uint uVar21;
  int_t iVar22;
  double *pdVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  void *pvVar33;
  long lVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  int_t *piVar38;
  uint nrow;
  int iVar39;
  doublecomplex *pdVar40;
  int iVar41;
  doublecomplex *Mxvec;
  double dVar42;
  double dVar43;
  double dVar44;
  int_t nzlumax;
  doublecomplex zero;
  void *local_e8;
  int_t local_bc;
  int_t *local_b8;
  int_t *local_b0;
  ulong local_a8;
  ulong local_a0;
  int_t local_94;
  long local_90;
  flops_t *local_88;
  int *local_80;
  long local_78;
  long local_70;
  long local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_88 = stat->ops;
  local_80 = Glu->xsup;
  local_58 = Glu->supno;
  piVar38 = Glu->lsub;
  local_b0 = Glu->xlsub;
  local_e8 = Glu->lusup;
  piVar11 = Glu->xlusup;
  local_bc = Glu->nzlumax;
  local_90 = (long)jcol;
  local_78 = (long)local_58[local_90];
  local_94 = local_bc;
  local_60 = repfnz;
  local_50 = segrep;
  if (0 < nseg) {
    uVar26 = (ulong)(uint)nseg;
    local_70 = (long)local_e8 + 8;
    uVar30 = 0;
    local_b8 = piVar38;
    do {
      piVar20 = local_b8;
      iVar39 = local_50[uVar26 - 1];
      local_a8 = uVar30;
      local_a0 = uVar26;
      if ((int)local_78 != local_58[iVar39]) {
        iVar24 = local_80[local_58[iVar39]];
        iVar25 = fpanelc;
        if (fpanelc < iVar24) {
          iVar25 = iVar24;
        }
        iVar36 = iVar25 - iVar24;
        iVar41 = piVar11[iVar25] + iVar36;
        iVar32 = local_b0[iVar24] + iVar36;
        iVar31 = local_60[iVar39];
        if (local_60[iVar39] <= fpanelc) {
          iVar31 = fpanelc;
        }
        uVar21 = (iVar39 - iVar31) + 1;
        uVar35 = iVar39 - iVar25;
        iVar10 = local_b0[(long)iVar24 + 1];
        lVar27 = (long)iVar10;
        iVar24 = iVar10 - local_b0[iVar24];
        nrow = (~uVar35 - iVar36) + iVar24;
        iVar37 = uVar35 + iVar32;
        local_88[0x13] = (float)(int)((iVar39 - iVar31) * uVar21 * 4) + local_88[0x13];
        iVar36 = uVar35 + iVar32 + 1;
        local_88[0x14] = (float)(int)(nrow * uVar21 * 8) + local_88[0x14];
        piVar38 = local_b8;
        if (iVar39 == iVar31) {
          if (iVar36 < iVar10) {
            dVar17 = dense[local_b8[iVar37]].r;
            dVar16 = dense[local_b8[iVar37]].i;
            lVar28 = (long)iVar36;
            pdVar23 = (double *)
                      ((long)(int)(iVar24 * uVar35 + iVar41 + uVar35 + 1) * 0x10 + local_70);
            do {
              iVar39 = local_b8[lVar28];
              dVar42 = pdVar23[-1];
              dVar43 = *pdVar23;
              dVar3 = dense[iVar39].i;
              dense[iVar39].r = dense[iVar39].r - (dVar42 * dVar17 + dVar43 * -dVar16);
              dense[iVar39].i = dVar3 - (dVar42 * dVar16 + dVar43 * dVar17);
              lVar28 = lVar28 + 1;
              pdVar23 = pdVar23 + 2;
            } while (lVar28 < lVar27);
          }
        }
        else if (iVar39 - iVar31 < 3) {
          iVar41 = (iVar24 + 1) * uVar35 + iVar41;
          iVar39 = local_b8[(long)iVar37 + -1];
          dVar17 = dense[local_b8[iVar37]].r;
          dVar16 = dense[local_b8[iVar37]].i;
          dVar42 = dense[iVar39].r;
          dVar43 = dense[iVar39].i;
          iVar25 = iVar41 - iVar24;
          if (uVar21 == 2) {
            lVar28 = (long)iVar25 * 0x10;
            dVar3 = *(double *)((long)local_e8 + lVar28 + 8);
            dVar17 = dVar17 - (*(double *)((long)local_e8 + lVar28) * dVar42 + dVar3 * -dVar43);
            dVar16 = dVar16 - (*(double *)((long)local_e8 + lVar28) * dVar43 + dVar3 * dVar42);
            dVar13.i._0_4_ = SUB84(dVar16,0);
            dVar13.r = dVar17;
            dVar13.i._4_4_ = (int)((ulong)dVar16 >> 0x20);
            dense[local_b8[iVar37]] = dVar13;
            if (iVar36 < iVar10) {
              lVar29 = (long)iVar36;
              pvVar33 = local_e8;
              do {
                iVar39 = local_b8[lVar29];
                dVar3 = *(double *)((long)pvVar33 + (long)iVar41 * 0x10 + 0x10);
                dVar4 = *(double *)((long)pvVar33 + (long)iVar41 * 0x10 + 0x18);
                dVar5 = *(double *)((long)pvVar33 + lVar28 + 0x10);
                dVar6 = *(double *)((long)pvVar33 + lVar28 + 0x18);
                dVar18 = dense[iVar39].i;
                dense[iVar39].r =
                     dense[iVar39].r -
                     (dVar5 * dVar42 + dVar6 * -dVar43 + dVar3 * dVar17 + dVar4 * -dVar16);
                dense[iVar39].i =
                     dVar18 - (dVar5 * dVar43 + dVar6 * dVar42 + dVar3 * dVar16 + dVar4 * dVar17);
                lVar29 = lVar29 + 1;
                pvVar33 = (void *)((long)pvVar33 + 0x10);
              } while (lVar29 < lVar27);
            }
          }
          else {
            lVar29 = (long)(iVar25 - iVar24) * 0x10;
            lVar28 = (long)iVar25 * 0x10;
            dVar6 = dense[local_b8[(long)iVar37 + -2]].r;
            dVar18 = dense[local_b8[(long)iVar37 + -2]].i;
            dVar44 = -dVar18;
            dVar3 = *(double *)((long)local_e8 + lVar29 + -0x10);
            dVar4 = *(double *)((long)local_e8 + lVar29 + -8);
            dVar5 = *(double *)((long)local_e8 + lVar29 + 8);
            dVar42 = dVar42 - (dVar3 * dVar6 + dVar4 * dVar44);
            dVar43 = dVar43 - (dVar3 * dVar18 + dVar4 * dVar6);
            dVar3 = *(double *)((long)local_e8 + lVar28 + 8);
            dVar17 = dVar17 - (*(double *)((long)local_e8 + lVar29) * dVar6 + dVar5 * dVar44 +
                              *(double *)((long)local_e8 + lVar28) * dVar42 + dVar3 * -dVar43);
            dVar16 = dVar16 - (*(double *)((long)local_e8 + lVar29) * dVar18 + dVar5 * dVar6 +
                              *(double *)((long)local_e8 + lVar28) * dVar43 + dVar3 * dVar42);
            dVar14.i._0_4_ = SUB84(dVar16,0);
            dVar14.r = dVar17;
            dVar14.i._4_4_ = (int)((ulong)dVar16 >> 0x20);
            dense[local_b8[iVar37]] = dVar14;
            dense[iVar39].r = dVar42;
            dense[iVar39].i = dVar43;
            if (iVar36 < iVar10) {
              lVar29 = (long)iVar36;
              lVar34 = (long)iVar24 * -0x10 + lVar28;
              pvVar33 = local_e8;
              do {
                iVar39 = local_b8[lVar29];
                dVar3 = *(double *)((long)pvVar33 + (long)iVar41 * 0x10 + 0x10);
                dVar4 = *(double *)((long)pvVar33 + (long)iVar41 * 0x10 + 0x18);
                dVar5 = *(double *)((long)pvVar33 + lVar28 + 0x10);
                dVar7 = *(double *)((long)pvVar33 + lVar28 + 0x18);
                dVar8 = *(double *)((long)pvVar33 + lVar34 + 0x10);
                dVar9 = *(double *)((long)pvVar33 + lVar34 + 0x18);
                dVar19 = dense[iVar39].i;
                dense[iVar39].r =
                     dense[iVar39].r -
                     (dVar8 * dVar6 + dVar9 * dVar44 +
                     dVar5 * dVar42 + dVar7 * -dVar43 + dVar3 * dVar17 + dVar4 * -dVar16);
                dense[iVar39].i =
                     dVar19 - (dVar8 * dVar18 + dVar9 * dVar6 +
                              dVar5 * dVar43 + dVar7 * dVar42 + dVar3 * dVar16 + dVar4 * dVar17);
                lVar29 = lVar29 + 1;
                pvVar33 = (void *)((long)pvVar33 + 0x10);
              } while (lVar29 < lVar27);
            }
          }
        }
        else {
          iVar32 = iVar32 + (iVar31 - iVar25);
          uVar26 = (ulong)((iVar39 - iVar31) + 1);
          lVar27 = 0;
          uVar30 = uVar26;
          do {
            dVar17 = dense[*(int *)((long)local_b8 + lVar27 + (long)iVar32 * 4)].i;
            pdVar23 = (double *)((long)&tempv->r + lVar27 * 4);
            *pdVar23 = dense[*(int *)((long)local_b8 + lVar27 + (long)iVar32 * 4)].r;
            pdVar23[1] = dVar17;
            lVar27 = lVar27 + 4;
            uVar30 = uVar30 - 1;
          } while (uVar30 != 0);
          local_68 = (long)((iVar24 + 1) * (iVar31 - iVar25) + iVar41);
          zlsolve(iVar24,uVar21,(doublecomplex *)(local_68 * 0x10 + (long)local_e8),tempv);
          Mxvec = tempv + uVar21;
          zmatvec(iVar24,nrow,uVar21,
                  (doublecomplex *)((long)(int)((int)local_68 + uVar21) * 0x10 + (long)local_e8),
                  tempv,Mxvec);
          uVar30 = 0;
          pdVar40 = tempv;
          iVar39 = iVar32;
          do {
            iVar24 = piVar20[(long)iVar32 + uVar30];
            dVar17 = pdVar40->i;
            dense[iVar24].r = pdVar40->r;
            dense[iVar24].i = dVar17;
            pdVar40->r = 0.0;
            pdVar40->i = 0.0;
            uVar30 = uVar30 + 1;
            pdVar40 = pdVar40 + 1;
            iVar39 = iVar39 + 1;
          } while (uVar26 != uVar30);
          piVar38 = local_b8;
          if (0 < (int)nrow) {
            uVar30 = 0;
            do {
              dVar17 = dense[local_b8[(long)iVar39 + uVar30]].i - Mxvec->i;
              dVar15.i._0_4_ = SUB84(dVar17,0);
              dVar15.r = dense[local_b8[(long)iVar39 + uVar30]].r - Mxvec->r;
              dVar15.i._4_4_ = (int)((ulong)dVar17 >> 0x20);
              dense[local_b8[(long)iVar39 + uVar30]] = dVar15;
              Mxvec->r = 0.0;
              Mxvec->i = 0.0;
              uVar30 = uVar30 + 1;
              Mxvec = Mxvec + 1;
            } while (uVar30 < nrow);
          }
        }
      }
      uVar26 = local_a0 - 1;
      uVar21 = (int)local_a8 + 1;
      uVar30 = (ulong)uVar21;
    } while (uVar21 != nseg);
  }
  iVar39 = piVar11[local_90];
  iVar24 = local_80[local_78];
  iVar25 = local_b0[iVar24];
  iVar32 = local_b0[(long)iVar24 + 1];
  iVar31 = (iVar32 + iVar39) - iVar25;
  if (local_94 < iVar31) {
    do {
      iVar22 = zLUMemXpand(jcol,iVar39,LUSUP,&local_bc,Glu);
      if (iVar22 != 0) {
        return iVar22;
      }
    } while (local_bc < iVar31);
    piVar38 = Glu->lsub;
    local_e8 = Glu->lusup;
    iVar25 = local_b0[iVar24];
    iVar32 = local_b0[(long)iVar24 + 1];
  }
  if (iVar25 < iVar32) {
    lVar27 = (long)iVar25;
    pdVar23 = (double *)((long)iVar39 * 0x10 + (long)local_e8);
    do {
      iVar25 = piVar38[lVar27];
      dVar17 = dense[iVar25].i;
      *pdVar23 = dense[iVar25].r;
      pdVar23[1] = dVar17;
      dense[iVar25].r = 0.0;
      dense[iVar25].i = 0.0;
      lVar27 = lVar27 + 1;
      pdVar23 = pdVar23 + 2;
      iVar39 = iVar39 + 1;
    } while (lVar27 < local_b0[(long)iVar24 + 1]);
  }
  if (fpanelc < iVar24) {
    fpanelc = iVar24;
  }
  piVar11[local_90 + 1] = iVar39;
  iVar39 = jcol - fpanelc;
  if (iVar39 != 0 && fpanelc <= jcol) {
    iVar25 = piVar11[fpanelc];
    iVar31 = local_b0[(long)iVar24 + 1] - local_b0[iVar24];
    uVar21 = (iVar24 - jcol) + iVar31;
    local_a8 = CONCAT44(local_a8._4_4_,iVar31);
    iVar32 = piVar11[local_90];
    local_88[0x13] = (float)((iVar39 + -1) * iVar39 * 4) + local_88[0x13];
    local_a0 = (long)iVar25 + (long)(fpanelc - iVar24);
    lVar27 = (long)iVar32 + (long)(fpanelc - iVar24);
    local_88[0x14] = (float)(int)(iVar39 * uVar21 * 8) + local_88[0x14];
    pdVar40 = (doublecomplex *)(lVar27 * 0x10 + (long)local_e8);
    zlsolve(iVar31,iVar39,(doublecomplex *)(local_a0 * 0x10 + (long)local_e8),pdVar40);
    zmatvec((int)local_a8,uVar21,iVar39,
            (doublecomplex *)((long)((int)local_a0 + iVar39) * 0x10 + (long)local_e8),pdVar40,tempv)
    ;
    if (0 < (int)uVar21) {
      iVar39 = (int)lVar27 + iVar39;
      lVar27 = 0;
      uVar30 = 0;
      do {
        pdVar2 = (double *)((long)local_e8 + lVar27 + (long)iVar39 * 0x10);
        pdVar23 = (double *)((long)&tempv->r + lVar27);
        dVar17 = pdVar2[1] - pdVar23[1];
        auVar12._8_4_ = SUB84(dVar17,0);
        auVar12._0_8_ = *pdVar2 - *pdVar23;
        auVar12._12_4_ = (int)((ulong)dVar17 >> 0x20);
        *(undefined1 (*) [16])((long)local_e8 + lVar27 + (long)iVar39 * 0x10) = auVar12;
        puVar1 = (undefined8 *)((long)&tempv->r + lVar27);
        *puVar1 = local_48;
        puVar1[1] = uStack_40;
        uVar30 = uVar30 + 1;
        lVar27 = lVar27 + 0x10;
      } while (uVar30 < uVar21);
    }
  }
  return 0;
}

Assistant:

int
zcolumn_bmod (
	     const int  jcol,	  /* in */
	     const int  nseg,	  /* in */
	     doublecomplex     *dense,	  /* in */
	     doublecomplex     *tempv,	  /* working array */
	     int        *segrep,  /* in */
	     int        *repfnz,  /* in */
	     int        fpanelc,  /* in -- first column in the current panel */
	     GlobalLU_t *Glu,     /* modified */
	     SuperLUStat_t *stat  /* output */
	     )
{

#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int         incx = 1, incy = 1;
    doublecomplex      alpha, beta;
    
    /* krep = representative of current k-th supernode
     * fsupc = first supernodal column
     * nsupc = no of columns in supernode
     * nsupr = no of rows in supernode (used as leading dimension)
     * luptr = location of supernodal LU-block in storage
     * kfnz = first nonz in the k-th supernodal segment
     * no_zeros = no of leading zeros in a supernodal U-segment
     */
    doublecomplex      ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          fsupc, nsupc, nsupr, segsze;
    int          nrow;	  /* No of rows in the matrix of matrix-vector */
    int          jcolp1, jsupno, k, ksub, krep, krep_ind, ksupno;
    int_t        lptr, kfnz, isub, irow, i;
    int_t        no_zeros, new_next, ufirst, nextlu;
    int          fst_col; /* First column within small LU update */
    int          d_fsupc; /* Distance between the first column of the current
			     panel and the first column of the current snode. */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    doublecomplex       *lusup;
    int_t        *xlusup;
    int_t        nzlumax;
    doublecomplex       *tempv1;
    doublecomplex      zero = {0.0, 0.0};
    doublecomplex      one = {1.0, 0.0};
    doublecomplex      none = {-1.0, 0.0};
    doublecomplex	 comp_temp, comp_temp1;
    int_t        mem_error;
    flops_t      *ops = stat->ops;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (doublecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    nzlumax = Glu->nzlumax;
    jcolp1 = jcol + 1;
    jsupno = supno[jcol];
    
    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {

	krep = segrep[k];
	k--;
	ksupno = supno[krep];
	if ( jsupno != ksupno ) { /* Outside the rectangular supernode */

	    fsupc = xsup[ksupno];
	    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

  	    /* Distance from the current supernode to the current panel; 
	       d_fsupc=0 if fsupc > fpanelc. */
  	    d_fsupc = fst_col - fsupc; 

	    luptr = xlusup[fst_col] + d_fsupc;
	    lptr = xlsub[fsupc] + d_fsupc;

	    kfnz = repfnz[krep];
	    kfnz = SUPERLU_MAX ( kfnz, fpanelc );

	    segsze = krep - kfnz + 1;
	    nsupc = krep - fst_col + 1;
	    nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	    nrow = nsupr - d_fsupc - nsupc;
	    krep_ind = lptr + nsupc - 1;

	    ops[TRSV] += 4 * segsze * (segsze - 1);
	    ops[GEMV] += 8 * nrow * segsze;



	    /* 
	     * Case 1: Update U-segment of size 1 -- col-col update 
	     */
	    if ( segsze == 1 ) {
	  	ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc;

		for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    irow = lsub[i];
		    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
		    z_sub(&dense[irow], &dense[irow], &comp_temp);
		    luptr++;
		}

	    } else if ( segsze <= 3 ) {
		ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc-1;
		ukj1 = dense[lsub[krep_ind - 1]];
		luptr1 = luptr - nsupr;

		if ( segsze == 2 ) { /* Case 2: 2cols-col update */
		    zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    z_sub(&ukj, &ukj, &comp_temp);
		    dense[lsub[krep_ind]] = ukj;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			z_add(&comp_temp, &comp_temp, &comp_temp1);
			z_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		} else { /* Case 3: 3cols-col update */
		    ukj2 = dense[lsub[krep_ind - 2]];
		    luptr2 = luptr1 - nsupr;
  		    zz_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		    z_sub(&ukj1, &ukj1, &comp_temp);

		    zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		    z_add(&comp_temp, &comp_temp, &comp_temp1);
		    z_sub(&ukj, &ukj, &comp_temp);

		    dense[lsub[krep_ind]] = ukj;
		    dense[lsub[krep_ind-1]] = ukj1;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			luptr2++;
			zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			z_add(&comp_temp, &comp_temp, &comp_temp1);
			zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			z_add(&comp_temp, &comp_temp, &comp_temp1);
			z_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		}


	    } else {
	  	/*
		 * Case: sup-col update
		 * Perform a triangular solve and block update,
		 * then scatter the result of sup-col update to dense
		 */

		no_zeros = kfnz - fst_col;

	        /* Copy U[*,j] segment from dense[*] to tempv[*] */
	        isub = lptr + no_zeros;
	        for (i = 0; i < segsze; i++) {
	  	    irow = lsub[isub];
		    tempv[i] = dense[irow];
		    ++isub; 
	        }

	        /* Dense triangular solve -- start effective triangle */
		luptr += nsupr * no_zeros + no_zeros; 
		
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#else		
		ztrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#endif		
 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
                alpha = one;
                beta = zero;
#ifdef _CRAY
		CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		zgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		zlsolve ( nsupr, segsze, &lusup[luptr], tempv );

 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
		zmatvec (nsupr, nrow , segsze, &lusup[luptr], tempv, tempv1);
#endif
		
		
                /* Scatter tempv[] into SPA dense[] as a temporary storage */
                isub = lptr + no_zeros;
                for (i = 0; i < segsze; i++) {
                    irow = lsub[isub];
                    dense[irow] = tempv[i];
                    tempv[i] = zero;
                    ++isub;
                }

		/* Scatter tempv1[] into SPA dense[] */
		for (i = 0; i < nrow; i++) {
		    irow = lsub[isub];
		    z_sub(&dense[irow], &dense[irow], &tempv1[i]);
		    tempv1[i] = zero;
		    ++isub;
		}
	    }
	    
	} /* if jsupno ... */

    } /* for each segment... */

    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    nextlu = xlusup[jcol];
    fsupc = xsup[jsupno];

    /* Copy the SPA dense into L\U[*,j] */
    new_next = nextlu + xlsub[fsupc+1] - xlsub[fsupc];
    while ( new_next > nzlumax ) {
	mem_error = zLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu);
	if (mem_error) return (mem_error);
	lusup = (doublecomplex *) Glu->lusup;
	lsub = Glu->lsub;
    }

    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = zero;
	++nextlu;
    }

    xlusup[jcolp1] = nextlu;	/* Close L\U[*,jcol] */

    /* For more updates within the panel (also within the current supernode), 
     * should start from the first column of the panel, or the first column 
     * of the supernode, whichever is bigger. There are 2 cases:
     *    1) fsupc < fpanelc, then fst_col := fpanelc
     *    2) fsupc >= fpanelc, then fst_col := fsupc
     */
    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

    if ( fst_col < jcol ) {

  	/* Distance between the current supernode and the current panel.
	   d_fsupc=0 if fsupc >= fpanelc. */
  	d_fsupc = fst_col - fsupc;

	lptr = xlsub[fsupc] + d_fsupc;
	luptr = xlusup[fst_col] + d_fsupc;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	nsupc = jcol - fst_col;	/* Excluding jcol */
	nrow = nsupr - d_fsupc - nsupc;

	/* Points to the beginning of jcol in snode L\U(jsupno) */
	ufirst = xlusup[jcol] + d_fsupc;	

	ops[TRSV] += 4 * nsupc * (nsupc - 1);
	ops[GEMV] += 8 * nrow * nsupc;
	
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#else
	ztrsv_( "L", "N", "U", &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#endif
	
	alpha = none; beta = one; /* y := beta*y + alpha*A*x */

#ifdef _CRAY
	CGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	zgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	zlsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );

	zmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc],
		&lusup[ufirst], tempv );
	
        /* Copy updates from tempv[*] into lusup[*] */
	isub = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    z_sub(&lusup[isub], &lusup[isub], &tempv[i]);
	    tempv[i] = zero;
	    ++isub;
	}

#endif
	
	
    } /* if fst_col < jcol ... */ 

    return 0;
}